

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_equation.hpp
# Opt level: O2

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_equation<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::ct_constant<8L>_>
                    *param_2)

{
  ostream *poVar1;
  ct_constant<8L> local_c;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  local_b;
  
  poVar1 = std::operator<<(stream,"ct_equation(");
  poVar1 = operator<<(poVar1,&local_b);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = operator<<(poVar1,&local_c);
  std::operator<<(poVar1,")");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_equation<LHS, RHS> const & /*u*/)
  {
    stream << "ct_equation(" << LHS() << " = " << RHS() << ")";
    return stream;
  }